

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O1

void __thiscall
OpenMD::Utils::AccumulatorView<OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>_>::writeData
          (AccumulatorView<OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>_> *this,
          ostream *stream,string *errorMessage,DataHandling dataHandling)

{
  size_t sVar1;
  int i;
  long lVar2;
  Vector3d dat;
  undefined1 local_58 [16];
  double local_48;
  double local_38;
  
  local_58 = (undefined1  [16])0x0;
  local_48 = 0.0;
  sVar1 = (this->super_Vector3dAccumulator).Count_;
  switch(dataHandling) {
  case Average:
    local_48 = (this->super_Vector3dAccumulator).Avg_.data_[2];
    local_58._0_8_ = (this->super_Vector3dAccumulator).Avg_.data_[0];
    local_58._8_8_ = (this->super_Vector3dAccumulator).Avg_.data_[1];
    break;
  case Last:
    local_48 = (this->super_Vector3dAccumulator).Val_.data_[2];
    local_58._0_8_ = (this->super_Vector3dAccumulator).Val_.data_[0];
    local_58._8_8_ = (this->super_Vector3dAccumulator).Val_.data_[1];
    break;
  case Max:
  case Min:
    memcpy(&painCave,"Max and Min functions are not defined for a std::vector Accumulator.",0x45);
    painCave.isFatal = 1;
    simError();
    goto switchD_0023218f_default;
  case Total:
    local_48 = (this->super_Vector3dAccumulator).Total_.data_[2];
    local_58._0_8_ = (this->super_Vector3dAccumulator).Total_.data_[0];
    local_58._8_8_ = (this->super_Vector3dAccumulator).Total_.data_[1];
    break;
  default:
    goto switchD_0023218f_default;
  }
switchD_0023218f_default:
  lVar2 = 0;
  do {
    if ((ulong)ABS(*(double *)(local_58 + lVar2 * 8)) < 0x7ff0000000000000) {
      local_38 = *(double *)(local_58 + lVar2 * 8);
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\t",1);
      if (sVar1 != 0) {
        std::ostream::_M_insert<double>(local_38);
      }
    }
    else {
      snprintf(painCave.errMsg,2000,"%s",(errorMessage->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      simError();
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return;
}

Assistant:

void writeData(std::ostream& stream, const std::string& errorMessage,
                   DataHandling dataHandling) const override {
      Vector3d dat;
      std::size_t count = Vector3dAccumulator::getCount();

      switch (dataHandling) {
      case DataHandling::Average:
        dat = Vector3dAccumulator::getAverage();
        break;
      case DataHandling::Last:
        dat = Vector3dAccumulator::getLastValue();
        break;
      case DataHandling::Total:
        dat = Vector3dAccumulator::getTotal();
        break;
      case DataHandling::Max:
      case DataHandling::Min:
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                 "Max and Min functions are not defined for a "
                 "std::vector Accumulator.");
        painCave.isFatal = 1;
        simError();
        break;
      default:
        break;
      }

      for (int i = 0; i < Vector3dAccumulator::getAverage().size(); i++) {
        if (std::isinf(dat[i]) || std::isnan(dat[i])) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                   errorMessage.c_str());
          painCave.isFatal = 1;
          simError();
        } else {
          if (count == 0)
            stream << "\t";
          else
            stream << "\t" << dat[i];
        }
      }
    }